

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBoxPrivate::handleButtonClicked(QDialogButtonBoxPrivate *this)

{
  bool bVar1;
  ButtonRole BVar2;
  QAbstractButton *pQVar3;
  QDialogButtonBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  ButtonRole buttonRole;
  QAbstractButton *button;
  QDialogButtonBox *q;
  QPointer<QDialogButtonBox> guard;
  QAbstractButton *in_stack_ffffffffffffffb8;
  QPointer<QDialogButtonBox> *in_stack_ffffffffffffffc0;
  QDialogButtonBox *in_stack_ffffffffffffffe8;
  QAbstractButton *button_00;
  
  button_00 = *(QAbstractButton **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QObject::sender();
  pQVar3 = qobject_cast<QAbstractButton*>((QObject *)0x66cc2c);
  if (pQVar3 != (QAbstractButton *)0x0) {
    BVar2 = QDialogButtonBox::buttonRole(in_stack_ffffffffffffffe8,button_00);
    QPointer<QDialogButtonBox>::QPointer<void>
              (in_stack_ffffffffffffffc0,(QDialogButtonBox *)in_stack_ffffffffffffffb8);
    QDialogButtonBox::clicked((QDialogButtonBox *)0x66cc86,in_stack_ffffffffffffffb8);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDialogButtonBox> *)0x66cc90);
    if (bVar1) {
      switch(BVar2) {
      case AcceptRole:
      case YesRole:
        QDialogButtonBox::accepted((QDialogButtonBox *)0x66cccd);
        break;
      case RejectRole:
      case NoRole:
        QDialogButtonBox::rejected((QDialogButtonBox *)0x66ccd9);
        break;
      default:
        break;
      case HelpRole:
        QDialogButtonBox::helpRequested((QDialogButtonBox *)0x66cce5);
      }
    }
    QPointer<QDialogButtonBox>::~QPointer((QPointer<QDialogButtonBox> *)0x66ccfb);
  }
  if (*(QAbstractButton **)(in_FS_OFFSET + 0x28) != button_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBoxPrivate::handleButtonClicked()
{
    Q_Q(QDialogButtonBox);
    if (QAbstractButton *button = qobject_cast<QAbstractButton *>(q->sender())) {
        // Can't fetch this *after* emitting clicked, as clicked may destroy the button
        // or change its role. Now changing the role is not possible yet, but arguably
        // both clicked and accepted/rejected/etc. should be emitted "atomically"
        // depending on whatever role the button had at the time of the click.
        const QDialogButtonBox::ButtonRole buttonRole = q->buttonRole(button);
        QPointer<QDialogButtonBox> guard(q);

        emit q->clicked(button);

        if (!guard)
            return;

        switch (QPlatformDialogHelper::ButtonRole(buttonRole)) {
        case QPlatformDialogHelper::AcceptRole:
        case QPlatformDialogHelper::YesRole:
            emit q->accepted();
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::NoRole:
            emit q->rejected();
            break;
        case QPlatformDialogHelper::HelpRole:
            emit q->helpRequested();
            break;
        default:
            break;
        }
    }
}